

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O0

void __thiscall test::iu_Foo_x_iutest_x_Bar_Test::Body(iu_Foo_x_iutest_x_Bar_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Foo_x_iutest_x_Bar_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_40[1] = 3;
  local_40[0] = 3;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"3","3",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
               ,0x73,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(Foo, Bar)
    {
        IUTEST_ASSERT_EQ(3, 3);
    }